

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInitElem
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayInitElem *curr)

{
  Literal *pLVar1;
  uint64_t uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  ElementSegment *pEVar5;
  size_type sVar6;
  Literal *other;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<wasm::GCData> sVar9;
  Flow local_1c0;
  undefined1 local_178 [8];
  Flow ref;
  Flow index;
  Flow offset;
  Flow size;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> data;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_178,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ref);
  if (ref.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_178);
    goto LAB_00d55951;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ref.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->index);
  if (index.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&index.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)local_178);
        sVar9 = Literal::getGCData((Literal *)local_48);
        if (local_48 == (undefined1  [8])0x0) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"null ref",
                     sVar9.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
        }
        pLVar1 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
        data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar1);
        pLVar1 = Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
        uVar2 = Literal::getUnsigned(pLVar1);
        pLVar1 = Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Literal::getUnsigned(pLVar1);
        lVar4 = (long)(((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar4 / 0x18 +
            (((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed <
            (ulong)((long)&(data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var3)) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds array access in array.init",lVar4 % 0x18);
        }
        pEVar5 = Module::getElementSegment
                           ((this->super_ExpressionRunner<wasm::ModuleRunner>).module,
                            (Name)(curr->segment).super_IString.str);
        uVar7 = (long)&p_Var3->_vptr__Sp_counted_base + uVar2;
        if ((ulong)((long)(pEVar5->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pEVar5->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar7) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in array.init_elem");
LAB_00d55873:
          sVar6 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedElementSegments)._M_h,&curr->segment);
          if (sVar6 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in array.init_elem");
          }
        }
        else if (uVar7 != 0) goto LAB_00d55873;
        lVar4 = (long)data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi * 0x18 + -0x18;
        data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             -data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        for (p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; p_Var3 != p_Var8;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var8->_vptr__Sp_counted_base + 1)) {
          ExpressionRunner<wasm::ModuleRunner>::visit
                    (&local_1c0,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                     (pEVar5->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)p_Var8]);
          other = Flow::getSingleValue(&local_1c0);
          pLVar1 = (((Literals *)((long)local_48 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                   ._M_elems;
          if (data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              p_Var8) {
            pLVar1 = (Literal *)
                     ((long)&((((Literals *)((long)local_48 + 8))->
                              super_SmallVector<wasm::Literal,_1UL>).flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar4);
          }
          Literal::operator=(pLVar1,other);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)&local_1c0);
          lVar4 = lVar4 + 0x18;
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
LAB_00d55951:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_178);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInitElem(ArrayInitElem* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    auto* seg = wasm.getElementSegment(curr->segment);
    auto max = (uint64_t)offsetVal + sizeVal;
    if (max > seg->data.size()) {
      trap("out of bounds segment access in array.init_elem");
    }
    if (max > 0 && droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in array.init_elem");
    }
    for (size_t i = 0; i < sizeVal; i++) {
      // TODO: This is not correct because it does not preserve the identity
      // of references in the table! ArrayNew suffers the same problem.
      // Fixing it will require changing how we represent segments, at least
      // in the interpreter.
      data->values[indexVal + i] = self()->visit(seg->data[i]).getSingleValue();
    }
    return {};
  }